

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VCloneEmptyVectorArray(int count,N_Vector W,int myid)

{
  N_Vector X;
  int iVar1;
  long lVar2;
  char *__format;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = get_time();
  lVar2 = N_VCloneEmptyVectorArray(count,W);
  dVar6 = get_time();
  if (count < 1 && lVar2 != 0) {
    printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n",(ulong)(uint)myid);
    printf("    count = %d, expected *vs = NULL \n\n",(ulong)(uint)count);
LAB_001032cc:
    iVar1 = 1;
  }
  else {
    uVar3 = 0;
    uVar4 = 0;
    if (0 < count) {
      uVar4 = (ulong)(uint)count;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      X = *(N_Vector *)(lVar2 + uVar3 * 8);
      if (X == (N_Vector)0x0) {
        printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n",(ulong)(uint)myid);
        __format = "    Vector[%d] = NULL \n\n";
LAB_001032b8:
        printf(__format,uVar3 & 0xffffffff);
        N_VDestroyVectorArray(lVar2,count);
        goto LAB_001032cc;
      }
      iVar1 = has_data(X);
      if (iVar1 != 0) {
        printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n",(ulong)(uint)myid);
        __format = "    Vector[%d] data != NULL \n\n";
        goto LAB_001032b8;
      }
    }
    N_VDestroyVectorArray(lVar2,count);
    if (myid == 0) {
      puts("PASSED test -- N_VCloneEmptyVectorArray ");
    }
    max_time(W,dVar6 - dVar5);
    iVar1 = 0;
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VCloneEmptyVectorArray");
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int Test_N_VCloneEmptyVectorArray(int count, N_Vector W, int myid)
{
  int i;
  double start_time, stop_time, maxt;
  N_Vector* vs;

  /* clone empty array */
  start_time = get_time();
  vs         = N_VCloneEmptyVectorArray(count, W);
  stop_time  = get_time();

  /* check array of vectors */
  if (count <= 0 && vs != NULL)
  {
    printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n", myid);
    printf("    count = %d, expected *vs = NULL \n\n", count);
    return (1);
  }

  /* check vectors in array */
  for (i = 0; i < count; i++)
  {
    if (vs[i] == NULL)
    {
      printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n", myid);
      printf("    Vector[%d] = NULL \n\n", i);
      N_VDestroyVectorArray(vs, count);
      return (1);
    }

    if (has_data(vs[i]))
    {
      printf(">>> FAILED test -- N_VCloneEmptyVectorArray, Proc %d \n", myid);
      printf("    Vector[%d] data != NULL \n\n", i);
      N_VDestroyVectorArray(vs, count);
      return (1);
    }
  }

  N_VDestroyVectorArray(vs, count);

  if (myid == 0) { printf("PASSED test -- N_VCloneEmptyVectorArray \n"); }

  /* find max time across all processes */
  maxt = max_time(W, stop_time - start_time);
  PRINT_TIME("N_VCloneEmptyVectorArray", maxt);

  return (0);
}